

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O2

void __thiscall Table::dbClose(Table *this)

{
  Pager *this_00;
  int iVar1;
  char *pcVar2;
  ostream *poVar3;
  uint32_t i;
  uint pageNum;
  
  std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  for (pageNum = 0; this_00 = this->pager, pageNum < this_00->numOfPages; pageNum = pageNum + 1) {
    pcVar2 = Pager::getPage(this_00,pageNum);
    if (pcVar2 != (char *)0x0) {
      Pager::_flush(this->pager,pageNum);
    }
  }
  iVar1 = Pager::_close(this_00);
  if (iVar1 != -1) {
    return;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Error closing file. Exiting...");
  std::endl<char,std::char_traits<char>>(poVar3);
  exit(1);
}

Assistant:

void Table::dbClose() {
	std::cout << pager->getNumOfPages();
	for (uint32_t i = 0; i < pager->getNumOfPages(); ++i) {
		if (pager->getPage(i) == nullptr)
			continue;
		pager->_flush(i);
	}

	int result = pager->_close();
	if (result == -1) {
		std::cout << "Error closing file. Exiting..." << std::endl;
		exit(EXIT_FAILURE);
	}
}